

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O3

void emit_lib(BuildCtx *ctx)

{
  char **ppcVar1;
  FILE *pFVar2;
  FILE *pFVar3;
  int iVar4;
  int iVar5;
  FILE *pFVar6;
  uint uVar7;
  BuildCtx *pBVar8;
  size_t sVar9;
  char *pcVar10;
  char *unaff_R12;
  char *pcVar11;
  uint8_t *puVar12;
  char buf [256];
  char acStack_1d0 [88];
  BuildCtx *pBStack_178;
  char *pcStack_170;
  BuildCtx *pBStack_168;
  FILE *pFStack_160;
  char *pcStack_158;
  code *pcStack_150;
  undefined8 local_140;
  byte local_138 [3];
  undefined5 uStack_135;
  short local_130;
  
  if (ctx->mode - BUILD_ffdef < 3) {
    pFVar6 = (FILE *)ctx->fp;
    pcVar10 = "/* This is a generated file. DO NOT EDIT! */\n\n";
    sVar9 = 0x2e;
LAB_0010a69e:
    pcStack_150 = (code *)0x10a6a8;
    fwrite(pcVar10,sVar9,1,pFVar6);
    if (ctx->mode == BUILD_recdef) {
      pcStack_150 = (code *)0x10a6c8;
      fwrite("static const uint16_t recff_idmap[] = {\n0,\n0x0100",0x31,1,(FILE *)ctx->fp);
    }
  }
  else if (ctx->mode == BUILD_vmdef) {
    pFVar6 = (FILE *)ctx->fp;
    pcVar10 = "ffnames = {\n[0]=\"Lua\",\n\"C\",\n";
    sVar9 = 0x1c;
    goto LAB_0010a69e;
  }
  ffid = 2;
  recffid = 2;
  ffasmfunc = 0;
  ppcVar1 = ctx->args;
  ctx->args = ppcVar1 + 1;
  pcVar10 = *ppcVar1;
  pFVar6 = _stdin;
  while (_stdin = pFVar6, pcVar10 != (char *)0x0) {
    if ((*pcVar10 != '-') || (pcVar10[1] != '\0')) {
      pcStack_150 = (code *)0x10a724;
      pFVar6 = fopen(pcVar10,"r");
      pBVar8 = ctx;
      if (pFVar6 == (FILE *)0x0) {
LAB_0010aae5:
        pcStack_150 = libdef_endmodule;
        pcVar11 = pcVar10;
        emit_lib_cold_1();
        if (modstate != 0) {
          pcStack_158 = "LJLIB_";
          pBStack_178 = pBVar8;
          pcStack_170 = unaff_R12;
          pBStack_168 = ctx;
          pFStack_160 = pFVar6;
          pcStack_150 = (code *)pcVar10;
          if (modstate == 1) {
            fwrite("  (lua_CFunction)0",0x12,1,*(FILE **)(pcVar11 + 0x10));
          }
          fwrite("\n};\n",4,1,*(FILE **)(pcVar11 + 0x10));
          fprintf(*(FILE **)(pcVar11 + 0x10),"static const uint8_t %s%s[] = {\n","lj_lib_init_",
                  modname);
          acStack_1d0[0] = '\0';
          puVar12 = obuf;
          if (obuf < optr) {
            iVar4 = 0;
            do {
              iVar5 = sprintf(acStack_1d0 + iVar4,"%d,",(ulong)*puVar12);
              iVar4 = iVar4 + iVar5;
              if (0x4a < iVar4) {
                iVar4 = 0;
                fprintf(*(FILE **)(pcVar11 + 0x10),"%s\n",acStack_1d0);
                acStack_1d0[0] = '\0';
              }
              puVar12 = puVar12 + 1;
            } while (puVar12 < optr);
          }
          fprintf(*(FILE **)(pcVar11 + 0x10),"%s%d\n};\n#endif\n\n",acStack_1d0,0xff);
        }
        return;
      }
    }
    modstate = 0;
    regfunc = 0;
    pcStack_150 = (code *)0x10a750;
    pcVar10 = fgets((char *)local_138,0x100,pFVar6);
    pFVar3 = pFVar6;
    pFVar2 = local_140;
    while (local_140 = pFVar3, pcVar10 != (char *)0x0) {
      if (((local_138[0] == 0x23) && (local_138[1] == 'i')) && (local_138[2] == 'f')) {
        pcStack_150 = (code *)0x10a780;
        sVar9 = strlen((char *)local_138);
        if ((local_138[sVar9 - 1] == 10) && (local_138[sVar9 - 1] = 0, local_138[sVar9 - 2] == 0xd))
        {
          local_138[sVar9 - 2] = 0;
        }
        if (local_130 != 0x32 ||
            CONCAT53(uStack_135,CONCAT12(local_138[2],CONCAT11(local_138[1],local_138[0]))) !=
            0x355f4a4c20666923) goto LAB_0010a7bc;
        pcStack_150 = (code *)0x10a89e;
        pcVar10 = fgets((char *)local_138,0x100,pFVar6);
        if (pcVar10 != (char *)0x0) {
          iVar4 = 1;
          do {
            if (local_138[2] == 'n' && (local_138[1] == 'e' && (local_138[0] ^ 0x23) == 0)) {
              iVar4 = iVar4 + -1;
              if (iVar4 == 0) break;
            }
            else {
              iVar4 = iVar4 + (uint)(local_138[2] == 'f' &&
                                    ((local_138[0] ^ 0x23) == 0 && local_138[1] == 'i'));
            }
            pcStack_150 = (code *)0x10a8f5;
            pcVar10 = fgets((char *)local_138,0x100,local_140);
          } while (pcVar10 != (char *)0x0);
        }
      }
      else {
LAB_0010a7bc:
        pcStack_150 = (code *)0x10a7c9;
        for (pcVar10 = strstr((char *)local_138,"LJLIB_"); pcVar10 != (char *)0x0;
            pcVar10 = strstr(pcVar10,"LJLIB_")) {
          pcVar10 = pcVar10 + 6;
          pBVar8 = (BuildCtx *)(libdef_handlers + 1);
          pcVar11 = "MODULE_";
          while( true ) {
            pcStack_150 = (code *)0x10a7ef;
            pFVar6 = (FILE *)strlen(pcVar11);
            pcStack_150 = (code *)0x10a800;
            iVar4 = strncmp(pcVar10,pcVar11,(size_t)pFVar6);
            if (iVar4 == 0) break;
            pcVar11 = ((LibDefHandler *)pBVar8)->suffix;
            pBVar8 = (BuildCtx *)((long)pBVar8 + 0x20);
            if (pcVar11 == (char *)0x0) {
              pcStack_150 = (code *)0x10aae5;
              emit_lib_cold_2();
              unaff_R12 = (char *)0x0;
              goto LAB_0010aae5;
            }
          }
          pcVar10 = pcVar10 + (long)pFVar6;
          if (((LibDefHandler *)((long)pBVar8 + -0x20))->stop == (char *)0x0) {
            unaff_R12 = (char *)0x0;
          }
          else {
            pcStack_150 = (code *)0x10a829;
            unaff_R12 = (char *)strcspn(pcVar10,((LibDefHandler *)((long)pBVar8 + -0x20))->stop);
          }
          if (pcVar10[(long)unaff_R12] != '\0') {
            unaff_R12[(long)pcVar10] = '\0';
            pcStack_150 = (code *)0x10a84d;
            (*((LibDefHandler *)((long)pBVar8 + -0x20))->func)
                      (ctx,pcVar10,((LibDefHandler *)((long)pBVar8 + -0x20))->arg);
            pcVar10 = unaff_R12 + (long)pcVar10 + 1;
            unaff_R12 = pcVar10;
          }
          pcStack_150 = (code *)0x10a85e;
        }
      }
      pFVar6 = local_140;
      pcStack_150 = (code *)0x10a881;
      pcVar10 = fgets((char *)local_138,0x100,local_140);
      pFVar3 = local_140;
      pFVar2 = local_140;
    }
    pcStack_150 = (code *)0x10a907;
    local_140 = pFVar2;
    fclose(pFVar6);
    if (ctx->mode == BUILD_libdef) {
      pcStack_150 = (code *)0x10a919;
      libdef_endmodule(ctx);
    }
    ppcVar1 = ctx->args;
    ctx->args = ppcVar1 + 1;
    pFVar6 = _stdin;
    pcVar10 = *ppcVar1;
  }
  switch(ctx->mode) {
  case BUILD_bcdef:
    pcStack_150 = (code *)0x10a97c;
    fwrite("\n};\n\n",5,1,(FILE *)ctx->fp);
    pcStack_150 = (code *)0x10a996;
    fwrite("LJ_DATADEF const uint16_t lj_bc_mode[] = {\n",0x2b,1,(FILE *)ctx->fp);
    pcStack_150 = (code *)0x10a9b0;
    fwrite("BCDEF(BCMODE)\n",0xe,1,(FILE *)ctx->fp);
    if (1 < ffasmfunc) {
      uVar7 = ffasmfunc + 1;
      do {
        pcStack_150 = (code *)0x10a9da;
        fwrite("BCMODE_FF,\n",0xb,1,(FILE *)ctx->fp);
        uVar7 = uVar7 - 1;
      } while (2 < uVar7);
    }
    pFVar6 = (FILE *)ctx->fp;
    pcVar10 = "BCMODE_FF\n};\n\n";
    sVar9 = 0xe;
    break;
  case BUILD_ffdef:
    pcStack_150 = (code *)0x10aa92;
    fwrite("\n#undef FFDEF\n\n",0xf,1,(FILE *)ctx->fp);
    pcStack_150 = (code *)0x10aaaa;
    fprintf((FILE *)ctx->fp,"#ifndef FF_NUM_ASMFUNC\n#define FF_NUM_ASMFUNC %d\n#endif\n\n",
            (ulong)(uint)ffasmfunc);
    return;
  default:
    goto switchD_0010a960_caseD_7;
  case BUILD_recdef:
    pcStack_150 = (code *)0x10aa10;
    fwrite("\n};\n\n",5,1,(FILE *)ctx->fp);
    pcStack_150 = (code *)0x10aa2a;
    fwrite("static const RecordFunc recff_func[] = {\nrecff_nyi,\nrecff_c",0x3b,1,(FILE *)ctx->fp);
    if (obuf[0] != '\0') {
      puVar12 = obuf;
      do {
        pcStack_150 = (code *)0x10aa52;
        fprintf((FILE *)ctx->fp,",\nrecff_%s",puVar12);
        pcStack_150 = (code *)0x10aa5a;
        sVar9 = strlen((char *)puVar12);
        puVar12 = puVar12 + sVar9 + 1;
      } while (*puVar12 != '\0');
    }
    pFVar6 = (FILE *)ctx->fp;
    pcVar10 = "\n};\n\n";
    sVar9 = 5;
    break;
  case BUILD_vmdef:
    pFVar6 = (FILE *)ctx->fp;
    pcVar10 = "},\n\n";
    sVar9 = 4;
  }
  pcStack_150 = (code *)0x10aac6;
  fwrite(pcVar10,sVar9,1,pFVar6);
switchD_0010a960_caseD_7:
  return;
}

Assistant:

void emit_lib(BuildCtx *ctx)
{
  const char *fname;

  if (ctx->mode == BUILD_ffdef || ctx->mode == BUILD_libdef ||
      ctx->mode == BUILD_recdef)
    fprintf(ctx->fp, "/* This is a generated file. DO NOT EDIT! */\n\n");
  else if (ctx->mode == BUILD_vmdef)
    fprintf(ctx->fp, "ffnames = {\n[0]=\"Lua\",\n\"C\",\n");
  if (ctx->mode == BUILD_recdef)
    fprintf(ctx->fp, "static const uint16_t recff_idmap[] = {\n0,\n0x0100");
  recffid = ffid = FF_C+1;
  ffasmfunc = 0;

  while ((fname = *ctx->args++)) {
    char buf[256];  /* We don't care about analyzing lines longer than that. */
    FILE *fp;
    if (fname[0] == '-' && fname[1] == '\0') {
      fp = stdin;
    } else {
      fp = fopen(fname, "r");
      if (!fp) {
	fprintf(stderr, "Error: cannot open input file '%s': %s\n",
		fname, strerror(errno));
	exit(1);
      }
    }
    modstate = 0;
    regfunc = REGFUNC_OK;
    while (fgets(buf, sizeof(buf), fp) != NULL) {
      char *p;
      /* Simplistic pre-processor. Only handles top-level #if/#endif. */
      if (buf[0] == '#' && buf[1] == 'i' && buf[2] == 'f') {
	int ok = 1;
	size_t len = strlen(buf);
	if (buf[len-1] == '\n') {
	  buf[len-1] = 0;
	  if (buf[len-2] == '\r') {
	    buf[len-2] = 0;
	  }
	}
	if (!strcmp(buf, "#if LJ_52"))
	  ok = LJ_52;
	else if (!strcmp(buf, "#if LJ_HASJIT"))
	  ok = LJ_HASJIT;
	else if (!strcmp(buf, "#if LJ_HASFFI"))
	  ok = LJ_HASFFI;
	else if (!strcmp(buf, "#if LJ_HASBUFFER"))
	  ok = LJ_HASBUFFER;
	if (!ok) {
	  int lvl = 1;
	  while (fgets(buf, sizeof(buf), fp) != NULL) {
	    if (buf[0] == '#' && buf[1] == 'e' && buf[2] == 'n') {
	      if (--lvl == 0) break;
	    } else if (buf[0] == '#' && buf[1] == 'i' && buf[2] == 'f') {
	      lvl++;
	    }
	  }
	  continue;
	}
      }
      for (p = buf; (p = strstr(p, LIBDEF_PREFIX)) != NULL; ) {
	const LibDefHandler *ldh;
	p += sizeof(LIBDEF_PREFIX)-1;
	for (ldh = libdef_handlers; ldh->suffix != NULL; ldh++) {
	  size_t n, len = strlen(ldh->suffix);
	  if (!strncmp(p, ldh->suffix, len)) {
	    p += len;
	    n = ldh->stop ? strcspn(p, ldh->stop) : 0;
	    if (!p[n]) break;
	    p[n] = '\0';
	    ldh->func(ctx, p, ldh->arg);
	    p += n+1;
	    break;
	  }
	}
	if (ldh->suffix == NULL) {
	  buf[strlen(buf)-1] = '\0';
	  fprintf(stderr, "Error: unknown library definition tag %s%s\n",
		  LIBDEF_PREFIX, p);
	  exit(1);
	}
      }
    }
    fclose(fp);
    if (ctx->mode == BUILD_libdef) {
      libdef_endmodule(ctx);
    }
  }

  if (ctx->mode == BUILD_ffdef) {
    fprintf(ctx->fp, "\n#undef FFDEF\n\n");
    fprintf(ctx->fp,
      "#ifndef FF_NUM_ASMFUNC\n#define FF_NUM_ASMFUNC %d\n#endif\n\n",
      ffasmfunc);
  } else if (ctx->mode == BUILD_vmdef) {
    fprintf(ctx->fp, "},\n\n");
  } else if (ctx->mode == BUILD_bcdef) {
    int i;
    fprintf(ctx->fp, "\n};\n\n");
    fprintf(ctx->fp, "LJ_DATADEF const uint16_t lj_bc_mode[] = {\n");
    fprintf(ctx->fp, "BCDEF(BCMODE)\n");
    for (i = ffasmfunc-1; i > 0; i--)
      fprintf(ctx->fp, "BCMODE_FF,\n");
    fprintf(ctx->fp, "BCMODE_FF\n};\n\n");
  } else if (ctx->mode == BUILD_recdef) {
    char *p = (char *)obuf;
    fprintf(ctx->fp, "\n};\n\n");
    fprintf(ctx->fp, "static const RecordFunc recff_func[] = {\n"
	    "recff_nyi,\n"
	    "recff_c");
    while (*p) {
      fprintf(ctx->fp, ",\nrecff_%s", p);
      p += strlen(p)+1;
    }
    fprintf(ctx->fp, "\n};\n\n");
  }
}